

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_mapper_test.cpp
# Opt level: O2

void __thiscall disp::h1_s(disp *this,string *param)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"h1_s:",param);
  std::__cxx11::string::operator=((string *)&this->v_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void h1_s(std::string param)
	{
		v_= "h1_s:"+param;
	}